

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall
soplex::SLUFactor<double>::solveLeft
          (SLUFactor<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *y,
          SVectorBase<double> *rhs1,SSVectorBase<double> *rhs2)

{
  double *pdVar1;
  double *pdVar2;
  element_type *this_00;
  int *piVar3;
  SSVectorBase<double> *this_01;
  double *vec;
  CLUFactor<double> *this_02;
  double *pdVar4;
  SSVectorBase<double> *in_RDX;
  SSVectorBase<double> *in_RSI;
  long in_RDI;
  Real eps;
  double epsilon;
  int *sidx;
  double *svec;
  int n2;
  int n1;
  CLUFactor<double> *in_stack_fffffffffffffec8;
  int n;
  SSVectorBase<double> *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffee0;
  undefined4 uVar5;
  int *in_stack_fffffffffffffee8;
  double *in_stack_fffffffffffffef0;
  SVectorBase<double> *in_stack_fffffffffffffef8;
  CLUFactor<double> *in_stack_ffffffffffffff00;
  double *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int iVar6;
  int *in_stack_ffffffffffffff28;
  int local_40;
  int local_3c;
  SSVectorBase<double> *local_28;
  SSVectorBase<double> *local_20;
  
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_28 = in_RDX;
  local_20 = in_RSI;
  (**(code **)(**(long **)(in_RDI + 0x388) + 0x18))();
  pdVar1 = SSVectorBase<double>::altValues(in_stack_fffffffffffffed0);
  pdVar2 = (double *)SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffed0);
  CLUFactor<double>::tolerances(in_stack_fffffffffffffec8);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x28a549);
  eps = Tolerances::epsilon(this_00);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x28a569);
  SSVectorBase<double>::clear(in_stack_fffffffffffffed0);
  SSVectorBase<double>::clear(in_stack_fffffffffffffed0);
  SSVectorBase<double>::assign<double>
            ((SSVectorBase<double> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_3c = SSVectorBase<double>::size((SSVectorBase<double> *)0x28a5c5);
  local_40 = SSVectorBase<double>::size((SSVectorBase<double> *)0x28a5d9);
  if (local_40 < 10) {
    piVar3 = (int *)(in_RDI + 0x10);
    SSVectorBase<double>::altValues(in_stack_fffffffffffffed0);
    SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffed0);
    pdVar1 = SSVectorBase<double>::altValues(in_stack_fffffffffffffed0);
    n = (int)((ulong)pdVar1 >> 0x20);
    this_01 = (SSVectorBase<double> *)SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffed0);
    pdVar1 = SSVectorBase<double>::altValues(in_stack_fffffffffffffed0);
    pdVar2 = (double *)SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffed0);
    CLUFactor<double>::vSolveLeft2sparse
              (in_stack_ffffffffffffff00,(double)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0
               ,&local_40,pdVar2,(int *)pdVar1,(int *)this_01,in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff18,
               (double *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff28,piVar3);
    SSVectorBase<double>::setSize(this_01,n);
    if (0 < local_40) {
      SSVectorBase<double>::forceSetup(local_28);
    }
  }
  else {
    vec = (double *)(in_RDI + 0x10);
    this_02 = (CLUFactor<double> *)SSVectorBase<double>::altValues(in_stack_fffffffffffffed0);
    SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffed0);
    iVar6 = local_3c;
    pdVar4 = SSVectorBase<double>::altValues(in_stack_fffffffffffffed0);
    n = (int)((ulong)pdVar4 >> 0x20);
    this_01 = (SSVectorBase<double> *)SSVectorBase<double>::altValues(in_stack_fffffffffffffed0);
    piVar3 = SSVectorBase<double>::altIndexMem(in_stack_fffffffffffffed0);
    local_3c = CLUFactor<double>::vSolveLeft2
                         (this_02,eps,vec,in_stack_fffffffffffffee8,
                          (double *)CONCAT44(uVar5,local_40),piVar3,(int)((ulong)this_01 >> 0x20),
                          pdVar1,pdVar2,(int *)CONCAT44(iVar6,in_stack_ffffffffffffff20),
                          (int)this_01);
  }
  SSVectorBase<double>::setSize(this_01,n);
  if (0 < local_3c) {
    SSVectorBase<double>::forceSetup(local_20);
  }
  SSVectorBase<double>::setSize(this_01,n);
  SSVectorBase<double>::forceSetup((SSVectorBase<double> *)(in_RDI + 0x278));
  *(int *)(in_RDI + 0x394) = *(int *)(in_RDI + 0x394) + 2;
  (**(code **)(**(long **)(in_RDI + 0x388) + 0x20))();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(
   SSVectorBase<R>&       x,
   SSVectorBase<R>&       y,
   const SVectorBase<R>& rhs1,
   SSVectorBase<R>&       rhs2) //const
{

   solveTime->start();

   int   n1, n2;
   R* svec = ssvec.altValues();
   int*  sidx = ssvec.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   ssvec.assign(rhs1);
   n1 = ssvec.size(); // see altValues();
   n2 = rhs2.size();

   if(n2 < 10)
   {
      this->vSolveLeft2sparse(epsilon,
                              x.altValues(), x.altIndexMem(),
                              svec, sidx, n1,
                              y.altValues(), y.altIndexMem(),
                              rhs2.altValues(), rhs2.altIndexMem(), n2);
      y.setSize(n2);

      if(n2 > 0)
         y.forceSetup();
   }
   else
   {
      n1 = this->vSolveLeft2(epsilon, x.altValues(), x.altIndexMem(), svec, sidx, n1,
                             y.altValues(), rhs2.altValues(), rhs2.altIndexMem(), n2);
      //      y.setup();
   }

   x.setSize(n1);

   if(n1 > 0)
      x.forceSetup();

   //   if (n2 > 0)
   //      y.forceSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 2;
   solveTime->stop();
}